

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O0

void __thiscall FilereaderLp::writeToFile(FilereaderLp *this,FILE *file,char *format,...)

{
  FILE *pFVar1;
  char in_AL;
  pointer pvVar2;
  size_type __maxlen;
  undefined8 in_RCX;
  char *in_RDX;
  FILE *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  HighsInt tokenlength;
  array<char,_561UL> stringbuffer;
  va_list argptr;
  undefined1 local_328 [24];
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  int local_270;
  array<char,_561UL> local_269;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  FILE *local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_2f8 = in_XMM0_Qa;
    local_2e8 = in_XMM1_Qa;
    local_2d8 = in_XMM2_Qa;
    local_2c8 = in_XMM3_Qa;
    local_2b8 = in_XMM4_Qa;
    local_2a8 = in_XMM5_Qa;
    local_298 = in_XMM6_Qa;
    local_288 = in_XMM7_Qa;
  }
  local_28 = local_328;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_310 = in_RCX;
  local_308 = in_R8;
  local_300 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_269,0,0x231);
  pvVar2 = std::array<char,_561UL>::data((array<char,_561UL> *)0x44da41);
  __maxlen = std::array<char,_561UL>::size(&local_269);
  local_270 = vsnprintf(pvVar2,__maxlen,local_18,&local_38);
  pFVar1 = local_10;
  if (*(int *)(in_RDI + 8) + local_270 < 0x230) {
    pvVar2 = std::array<char,_561UL>::data((array<char,_561UL> *)0x44db07);
    fprintf(pFVar1,"%s",pvVar2);
    *(int *)(in_RDI + 8) = local_270 + *(int *)(in_RDI + 8);
  }
  else {
    fprintf(local_10,"\n");
    pFVar1 = local_10;
    pvVar2 = std::array<char,_561UL>::data((array<char,_561UL> *)0x44dac7);
    fprintf(pFVar1,"%s",pvVar2);
    *(int *)(in_RDI + 8) = local_270;
  }
  return;
}

Assistant:

void FilereaderLp::writeToFile(FILE* file, const char* format, ...) {
  va_list argptr;
  va_start(argptr, format);
  std::array<char, LP_MAX_LINE_LENGTH + 1> stringbuffer = {};
  HighsInt tokenlength =
      vsnprintf(stringbuffer.data(), stringbuffer.size(), format, argptr);
  va_end(argptr);
  if (this->linelength + tokenlength >= LP_MAX_LINE_LENGTH) {
    fprintf(file, "\n");
    fprintf(file, "%s", stringbuffer.data());
    this->linelength = tokenlength;
  } else {
    fprintf(file, "%s", stringbuffer.data());
    this->linelength += tokenlength;
  }
}